

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trans_rvm.inc.c
# Opt level: O0

_Bool trans_mulh(DisasContext_conflict12 *ctx,arg_mulh *a)

{
  TCGContext_conflict11 *tcg_ctx_00;
  _Bool _Var1;
  TCGv_i64 t;
  TCGv_i64 t_00;
  TCGv_i64 source2;
  TCGv_i64 source1;
  TCGContext_conflict11 *tcg_ctx;
  arg_mulh *a_local;
  DisasContext_conflict12 *ctx_local;
  
  tcg_ctx_00 = ctx->uc->tcg_ctx;
  _Var1 = has_ext(ctx,0x1000);
  if (_Var1) {
    t = tcg_temp_new_i64(tcg_ctx_00);
    t_00 = tcg_temp_new_i64(tcg_ctx_00);
    gen_get_gpr(tcg_ctx_00,t,a->rs1);
    gen_get_gpr(tcg_ctx_00,t_00,a->rs2);
    tcg_gen_muls2_i64_riscv64(tcg_ctx_00,t_00,t,t,t_00);
    gen_set_gpr(tcg_ctx_00,a->rd,t);
    tcg_temp_free_i64(tcg_ctx_00,t);
    tcg_temp_free_i64(tcg_ctx_00,t_00);
  }
  return _Var1;
}

Assistant:

static bool trans_mulh(DisasContext *ctx, arg_mulh *a)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    REQUIRE_EXT(ctx, RVM);
    TCGv source1 = tcg_temp_new(tcg_ctx);
    TCGv source2 = tcg_temp_new(tcg_ctx);
    gen_get_gpr(tcg_ctx, source1, a->rs1);
    gen_get_gpr(tcg_ctx, source2, a->rs2);

    tcg_gen_muls2_tl(tcg_ctx, source2, source1, source1, source2);

    gen_set_gpr(tcg_ctx, a->rd, source1);
    tcg_temp_free(tcg_ctx, source1);
    tcg_temp_free(tcg_ctx, source2);
    return true;
}